

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegressionTree.cpp
# Opt level: O2

void __thiscall RegressionTree::regressionTreeQueries(RegressionTree *this)

{
  pointer pbVar1;
  Query *pQVar2;
  vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_> *pvVar3;
  Function *pFVar4;
  Query *pQVar5;
  vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_> *this_00;
  size_t f;
  ulong __position;
  ulong __position_00;
  QueryThresholdPair qtPair;
  Query *local_58;
  long local_50;
  Query *local_48;
  Function *local_40;
  vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_> *local_38;
  
  pQVar2 = (Query *)operator_new(0x30);
  (((_Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_> *)&pQVar2->_rootID)->
  _M_impl).super__Vector_impl_data._M_start = (pointer)0x0;
  (pQVar2->_fVars).super__Base_bitset<2UL>._M_w[0] = 0;
  (pQVar2->_fVars).super__Base_bitset<2UL>._M_w[1] = 0;
  (pQVar2->_aggregates).super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pQVar2->_aggregates).super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pQVar2->_aggregates).super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pvVar3 = (vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_> *)operator_new(0x30);
  (pvVar3->super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pvVar3->super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pvVar3->super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pvVar3[1].super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  pvVar3[1].super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pvVar3[1].super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pFVar4 = (Function *)operator_new(0x30);
  (((_Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_> *)&pFVar4->_fVars)->
  _M_impl).super__Vector_impl_data._M_start = (pointer)0x0;
  (((_Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_> *)&pFVar4->_fVars)->
  _M_impl).super__Vector_impl_data._M_finish = (pointer)0x0;
  *(pointer *)&pFVar4->_operation = (pointer)0x0;
  pFVar4->_parameter = (double *)0x0;
  *(undefined8 *)&pFVar4->_dynamic = 0;
  (pFVar4->_name)._M_dataplus._M_p = (pointer)0x0;
  std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>::push_back
            ((vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_> *)pQVar2,
             (this->_candidateMask).
             super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>._M_impl.
             super__Vector_impl_data._M_start + 100);
  std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>::push_back
            (pvVar3,(this->_candidateMask).
                    super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>.
                    _M_impl.super__Vector_impl_data._M_start + 100);
  std::bitset<1500UL>::set
            ((pvVar3->super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>
             )._M_impl.super__Vector_impl_data._M_start,0,true);
  std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>::push_back
            ((vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_> *)pFVar4,
             (this->_candidateMask).
             super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>._M_impl.
             super__Vector_impl_data._M_start + 100);
  std::bitset<1500UL>::set
            ((((_Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_> *)
              &pFVar4->_fVars)->_M_impl).super__Vector_impl_data._M_start,1,true);
  pQVar5 = (Query *)operator_new(0x30);
  (pQVar5->_fVars).super__Base_bitset<2UL>._M_w[0] = 0;
  (pQVar5->_fVars).super__Base_bitset<2UL>._M_w[1] = 0;
  (pQVar5->_aggregates).super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pQVar5->_aggregates).super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pQVar5->_aggregates).super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pQVar5->_rootID =
       ((this->_td).super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->_root
       ->_id;
  qtPair.query = pQVar2;
  qtPair.varID = (size_t)pvVar3;
  qtPair.function = pFVar4;
  std::vector<Aggregate*,std::allocator<Aggregate*>>::_M_assign_aux<Aggregate*const*>
            ((vector<Aggregate*,std::allocator<Aggregate*>> *)&pQVar5->_aggregates,&qtPair);
  local_58 = pQVar5;
  QueryCompiler::addQuery
            ((this->_compiler).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             pQVar5);
  for (__position = 0; __position != 100; __position = __position + 1) {
    if (((this->_features).super__Base_bitset<2UL>._M_w[__position >> 6] >> (__position & 0x3f) & 1)
        != 0) {
      if (((this->_categoricalFeatures).super__Base_bitset<2UL>._M_w[__position >> 6] &
          1L << ((byte)__position & 0x3f)) == 0) {
        local_50 = __position * 0xc0;
        for (__position_00 = 0; __position_00 != 0x5dc; __position_00 = __position_00 + 1) {
          pbVar1 = (this->_candidateMask).
                   super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          if ((*(ulong *)((long)(pbVar1->super__Base_bitset<24UL>)._M_w +
                         (__position_00 >> 6) * 8 + local_50) >> (__position_00 & 0x3f) & 1) != 0) {
            pQVar2 = (Query *)operator_new(0x30);
            (((_Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_> *)
             &pQVar2->_rootID)->_M_impl).super__Vector_impl_data._M_start = (pointer)0x0;
            (pQVar2->_fVars).super__Base_bitset<2UL>._M_w[0] = 0;
            (pQVar2->_fVars).super__Base_bitset<2UL>._M_w[1] = 0;
            (pQVar2->_aggregates).super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            (pQVar2->_aggregates).super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>.
            _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            (pQVar2->_aggregates).super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            pvVar3 = (vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_> *)
                     operator_new(0x30);
            (pvVar3->super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>)
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            (pvVar3->super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>)
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            (pvVar3->super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>)
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            pvVar3[1].super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            pvVar3[1].super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            pvVar3[1].super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            pFVar4 = (Function *)operator_new(0x30);
            (((_Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_> *)
             &pFVar4->_fVars)->_M_impl).super__Vector_impl_data._M_start = (pointer)0x0;
            (((_Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_> *)
             &pFVar4->_fVars)->_M_impl).super__Vector_impl_data._M_finish = (pointer)0x0;
            *(pointer *)&pFVar4->_operation = (pointer)0x0;
            pFVar4->_parameter = (double *)0x0;
            *(undefined8 *)&pFVar4->_dynamic = 0;
            (pFVar4->_name)._M_dataplus._M_p = (pointer)0x0;
            std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>::push_back
                      ((vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_> *)pQVar2,
                       pbVar1 + 100);
            std::bitset<1500UL>::set
                      ((((_Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_> *
                         )&pQVar2->_rootID)->_M_impl).super__Vector_impl_data._M_start,__position_00
                       ,true);
            local_38 = pvVar3;
            std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>::push_back
                      (pvVar3,(this->_candidateMask).
                              super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>
                              ._M_impl.super__Vector_impl_data._M_start + 100);
            std::bitset<1500UL>::set
                      ((pvVar3->
                       super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>
                       )._M_impl.super__Vector_impl_data._M_start,0,true);
            std::bitset<1500UL>::set
                      ((pvVar3->
                       super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>
                       )._M_impl.super__Vector_impl_data._M_start,__position_00,true);
            local_40 = pFVar4;
            std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>::push_back
                      ((vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_> *)pFVar4,
                       (this->_candidateMask).
                       super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + 100);
            std::bitset<1500UL>::set
                      ((((_Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_> *
                         )&pFVar4->_fVars)->_M_impl).super__Vector_impl_data._M_start,1,true);
            std::bitset<1500UL>::set
                      ((((_Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_> *
                         )&pFVar4->_fVars)->_M_impl).super__Vector_impl_data._M_start,__position_00,
                       true);
            pQVar5 = (Query *)operator_new(0x30);
            (((_Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_> *)
             &pQVar5->_rootID)->_M_impl).super__Vector_impl_data._M_start = (pointer)0x0;
            (pQVar5->_fVars).super__Base_bitset<2UL>._M_w[0] = 0;
            (pQVar5->_fVars).super__Base_bitset<2UL>._M_w[1] = 0;
            (pQVar5->_aggregates).super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            (pQVar5->_aggregates).super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>.
            _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            (pQVar5->_aggregates).super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            pvVar3 = (vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_> *)
                     operator_new(0x30);
            (pvVar3->super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>)
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            (pvVar3->super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>)
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            (pvVar3->super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>)
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            pvVar3[1].super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            pvVar3[1].super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            pvVar3[1].super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            this_00 = (vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_> *)
                      operator_new(0x30);
            (this_00->super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>
            )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            (this_00->super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>
            )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            (this_00->super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>
            )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            this_00[1].
            super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            this_00[1].
            super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            this_00[1].
            super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            local_48 = pQVar5;
            std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>::push_back
                      ((vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_> *)pQVar5,
                       (this->_candidateMask).
                       super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + 100);
            std::bitset<1500UL>::set
                      ((((_Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_> *
                         )&pQVar5->_rootID)->_M_impl).super__Vector_impl_data._M_start,
                       this->_complementFunction[__position_00],true);
            std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>::push_back
                      (pvVar3,(this->_candidateMask).
                              super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>
                              ._M_impl.super__Vector_impl_data._M_start + 100);
            std::bitset<1500UL>::set
                      ((pvVar3->
                       super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>
                       )._M_impl.super__Vector_impl_data._M_start,0,true);
            std::bitset<1500UL>::set
                      ((pvVar3->
                       super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>
                       )._M_impl.super__Vector_impl_data._M_start,
                       this->_complementFunction[__position_00],true);
            std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>::push_back
                      (this_00,(this->_candidateMask).
                               super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + 100);
            std::bitset<1500UL>::set
                      ((this_00->
                       super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>
                       )._M_impl.super__Vector_impl_data._M_start,1,true);
            std::bitset<1500UL>::set
                      ((this_00->
                       super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>
                       )._M_impl.super__Vector_impl_data._M_start,
                       this->_complementFunction[__position_00],true);
            pQVar5 = (Query *)operator_new(0x30);
            (pQVar5->_aggregates).super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            (pQVar5->_fVars).super__Base_bitset<2UL>._M_w[0] = 0;
            (pQVar5->_fVars).super__Base_bitset<2UL>._M_w[1] = 0;
            (pQVar5->_aggregates).super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            (pQVar5->_aggregates).super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>.
            _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            pQVar5->_rootID = this->_queryRootIndex[__position];
            qtPair.varID = (size_t)local_38;
            qtPair.function = local_40;
            qtPair.complementQuery = local_48;
            qtPair.query = pQVar2;
            std::vector<Aggregate*,std::allocator<Aggregate*>>::_M_assign_aux<Aggregate*const*>
                      ((vector<Aggregate*,std::allocator<Aggregate*>> *)&pQVar5->_aggregates,&qtPair
                       ,&local_58);
            QueryCompiler::addQuery
                      ((this->_compiler).
                       super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>._M_ptr,pQVar5);
            this->_varToQueryMap[__position] = pQVar5;
            qtPair.complementQuery = (Query *)0x0;
            qtPair.query = pQVar5;
            qtPair.varID = __position;
            qtPair.function =
                 QueryCompiler::getFunction
                           ((this->_compiler).
                            super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                            __position_00);
            std::vector<QueryThresholdPair,_std::allocator<QueryThresholdPair>_>::push_back
                      (&queryToThreshold,&qtPair);
          }
        }
      }
      else {
        pQVar2 = (Query *)operator_new(0x30);
        (((_Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_> *)
         &pQVar2->_rootID)->_M_impl).super__Vector_impl_data._M_start = (pointer)0x0;
        (pQVar2->_fVars).super__Base_bitset<2UL>._M_w[0] = 0;
        (pQVar2->_fVars).super__Base_bitset<2UL>._M_w[1] = 0;
        (pQVar2->_aggregates).super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        (pQVar2->_aggregates).super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        (pQVar2->_aggregates).super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        pvVar3 = (vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_> *)
                 operator_new(0x30);
        (pvVar3->super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>).
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        (pvVar3->super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>).
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        (pvVar3->super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>).
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        pvVar3[1].super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        pvVar3[1].super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        pvVar3[1].super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        pFVar4 = (Function *)operator_new(0x30);
        (((_Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_> *)
         &pFVar4->_fVars)->_M_impl).super__Vector_impl_data._M_start = (pointer)0x0;
        (((_Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_> *)
         &pFVar4->_fVars)->_M_impl).super__Vector_impl_data._M_finish = (pointer)0x0;
        *(pointer *)&pFVar4->_operation = (pointer)0x0;
        pFVar4->_parameter = (double *)0x0;
        *(undefined8 *)&pFVar4->_dynamic = 0;
        (pFVar4->_name)._M_dataplus._M_p = (pointer)0x0;
        std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>::push_back
                  ((vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_> *)pQVar2,
                   (this->_candidateMask).
                   super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>.
                   _M_impl.super__Vector_impl_data._M_start + 100);
        std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>::push_back
                  (pvVar3,(this->_candidateMask).
                          super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + 100);
        std::bitset<1500UL>::set
                  ((pvVar3->
                   super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>).
                   _M_impl.super__Vector_impl_data._M_start,0,true);
        std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>::push_back
                  ((vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_> *)pFVar4,
                   (this->_candidateMask).
                   super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>.
                   _M_impl.super__Vector_impl_data._M_start + 100);
        std::bitset<1500UL>::set
                  ((((_Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_> *)
                    &pFVar4->_fVars)->_M_impl).super__Vector_impl_data._M_start,1,true);
        pQVar5 = (Query *)operator_new(0x30);
        (pQVar5->_fVars).super__Base_bitset<2UL>._M_w[0] = 0;
        (pQVar5->_fVars).super__Base_bitset<2UL>._M_w[1] = 0;
        (pQVar5->_aggregates).super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        (pQVar5->_aggregates).super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        (pQVar5->_aggregates).super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        pQVar5->_rootID = this->_queryRootIndex[__position];
        qtPair.query = pQVar2;
        qtPair.varID = (size_t)pvVar3;
        qtPair.function = pFVar4;
        std::vector<Aggregate*,std::allocator<Aggregate*>>::_M_assign_aux<Aggregate*const*>
                  ((vector<Aggregate*,std::allocator<Aggregate*>> *)&pQVar5->_aggregates,&qtPair,
                   &qtPair.complementQuery);
        std::bitset<100UL>::set(&pQVar5->_fVars,__position,true);
        QueryCompiler::addQuery
                  ((this->_compiler).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr,pQVar5);
        qtPair.function = (Function *)0x0;
        qtPair.complementQuery = local_58;
        this->_varToQueryMap[__position] = pQVar5;
        qtPair.query = pQVar5;
        qtPair.varID = __position;
        std::vector<QueryThresholdPair,_std::allocator<QueryThresholdPair>_>::push_back
                  (&queryToThreshold,&qtPair);
      }
    }
  }
  return;
}

Assistant:

void RegressionTree::regressionTreeQueries()
{

    Aggregate* countC = new Aggregate();
    Aggregate* countL = new Aggregate();
    Aggregate* countQ = new Aggregate();
                
    /* Q_C */
    countC->_agg.push_back(_candidateMask[NUM_OF_VARIABLES]);
                            
    /* Q_L */
    countL->_agg.push_back(_candidateMask[NUM_OF_VARIABLES]);
    countL->_agg[0].set(0);
        
    /* Q_Q */
    countQ->_agg.push_back(_candidateMask[NUM_OF_VARIABLES]);
    countQ->_agg[0].set(1);

    // We add an additional query without free vars to compute the
    // complement of each threshold 
    Query* countQuery = new Query();
    countQuery->_rootID = _td->_root->_id;  
    countQuery->_aggregates = {countC,countL,countQ};

    _compiler->addQuery(countQuery);

    for (size_t var=0; var < NUM_OF_VARIABLES; ++var)
    {
        if (_features[var])
        {
            if (_categoricalFeatures[var])
            {
                Aggregate* aggC = new Aggregate();
                Aggregate* aggL = new Aggregate();
                Aggregate* aggQ = new Aggregate();
                
                /* Q_C */
                aggC->_agg.push_back(_candidateMask[NUM_OF_VARIABLES]);
                            
                /* Q_L */
                aggL->_agg.push_back(_candidateMask[NUM_OF_VARIABLES]);
                aggL->_agg[0].set(0);
        
                /* Q_Q */
                aggQ->_agg.push_back(_candidateMask[NUM_OF_VARIABLES]);
                aggQ->_agg[0].set(1);

                
                Query* query = new Query();
                query->_rootID = _queryRootIndex[var];  
                query->_aggregates = {aggC,aggL,aggQ};
                query->_fVars.set(var);
                
                _compiler->addQuery(query);


                QueryThresholdPair qtPair;
                qtPair.query = query;
                qtPair.varID = var;
                qtPair.function = nullptr;
                qtPair.complementQuery = countQuery;
                
                _varToQueryMap[var] = query;

                queryToThreshold.push_back(qtPair);
            }
            else /* Continuous Variable */
            {
                /* We create a query for each threshold for this variable */ 
                for (size_t f = 0; f < NUM_OF_FUNCTIONS; ++f)
                {
                    if (!_candidateMask[var][f])
                        continue;
                    
                    Aggregate* aggC = new Aggregate();
                    Aggregate* aggL = new Aggregate();
                    Aggregate* aggQ = new Aggregate();
        
                    /* Q_C */
                    aggC->_agg.push_back(_candidateMask[NUM_OF_VARIABLES]);
                    aggC->_agg[0].set(f);

                    /* Q_L */
                    aggL->_agg.push_back(_candidateMask[NUM_OF_VARIABLES]);
                    aggL->_agg[0].set(0);
                    aggL->_agg[0].set(f);
        
                    /* Q_Q */
                    aggQ->_agg.push_back(_candidateMask[NUM_OF_VARIABLES]);
                    aggQ->_agg[0].set(1);
                    aggQ->_agg[0].set(f);
                                        
                    Aggregate* aggC_complement = new Aggregate();
                    Aggregate* aggL_complement = new Aggregate();
                    Aggregate* aggQ_complement = new Aggregate();
        
                    /* Q_C */
                    aggC_complement->_agg.push_back(_candidateMask[NUM_OF_VARIABLES]);
                    aggC_complement->_agg[0].set(_complementFunction[f]);

                    /* Q_L */
                    aggL_complement->_agg.push_back(_candidateMask[NUM_OF_VARIABLES]);
                    aggL_complement->_agg[0].set(0);
                    aggL_complement->_agg[0].set(_complementFunction[f]);
        
                    /* Q_Q */
                    aggQ_complement->_agg.push_back(_candidateMask[NUM_OF_VARIABLES]);
                    aggQ_complement->_agg[0].set(1);
                    aggQ_complement->_agg[0].set(_complementFunction[f]);

                    Query* query = new Query();
                    query->_rootID =  _queryRootIndex[var]; // _td->_root->_id;
                    query->_aggregates = {aggC,aggL,aggQ,
                         aggC_complement,aggL_complement,aggQ_complement};
                    
                    _compiler->addQuery(query);
                    _varToQueryMap[var] = query;
                    
                    QueryThresholdPair qtPair;
                    qtPair.query = query;
                    qtPair.varID = var;
                    qtPair.function = _compiler->getFunction(f);
                    
                    queryToThreshold.push_back(qtPair);
                }
            }
        }
    }
}